

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::anon_unknown_0::ReconstructCollectionProperties
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *table,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                       *properties,Collection *coll,string *warn,string *err,
               bool strict_allowedToken_check)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Base_ptr p_Var3;
  void *pvVar4;
  undefined5 uVar5;
  fmt fVar6;
  undefined1 uVar7;
  PrimVar *this;
  int iVar8;
  const_iterator cVar9;
  ulong uVar10;
  CollectionInstance *pCVar11;
  _Rb_tree_node_base *p_Var12;
  long *plVar13;
  ostream *poVar14;
  vector<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
  *pvVar15;
  undefined8 uVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  undefined8 extraout_RAX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  undefined4 uVar19;
  long lVar20;
  _Rb_tree_node_base *p_Var21;
  _Rb_tree_header *p_Var22;
  char *pcVar23;
  _Alloc_hider _Var24;
  TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *args_1;
  undefined7 in_register_00000089;
  _Base_ptr p_Var25;
  uint uVar26;
  char cVar27;
  bool bVar28;
  bool bVar29;
  Animatable<bool> animatable_value;
  ParseResult ret;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  optional<tinyusdz::Animatable<bool>_> av;
  string attr_type_name;
  string instance_name;
  function<nonstd::expected_lite::expected<tinyusdz::CollectionInstance::ExpansionRule,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ExpansionRuleEnumHandler;
  string suffix;
  ostringstream ss_e;
  undefined1 local_670 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  uint local_63c;
  _Rb_tree_node_base *local_638;
  undefined4 local_62c;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_628;
  undefined1 local_620 [32];
  bool bStack_600;
  uint local_5f8;
  undefined1 local_5f0 [32];
  string *local_5d0;
  ordered_dict<tinyusdz::CollectionInstance> *local_5c8;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_5c0;
  _Base_ptr local_5b8;
  undefined4 local_5ac;
  string local_5a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  undefined1 local_548 [10];
  undefined6 uStack_53e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_538;
  bool bStack_528;
  undefined7 uStack_527;
  char local_520;
  ios_base local_4d8 [16];
  ios_base local_4c8 [264];
  _Base_ptr local_3c0;
  undefined1 local_3b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  code *local_388;
  undefined8 uStack_380;
  undefined1 local_378 [32];
  undefined4 *local_358;
  undefined8 local_350;
  undefined4 local_348;
  uint uStack_344;
  undefined8 local_338;
  undefined8 uStack_330;
  code *local_328;
  code *pcStack_320;
  PrimVar *local_310;
  _Base_ptr local_308;
  _Rb_tree_node_base *local_300;
  string local_2f8;
  long *local_2d8 [2];
  long local_2c8 [2];
  undefined1 local_2b8 [136];
  bool local_230;
  storage_t<double> local_228;
  bool local_220;
  storage_t<tinyusdz::Token> local_218;
  bool local_1f8;
  storage_t<tinyusdz::Token> local_1f0;
  bool local_1d0;
  storage_t<tinyusdz::Token> local_1c8;
  bool local_1a8;
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_1a0;
  bool local_170;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  bool local_148;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  bool local_120;
  storage_t<tinyusdz::Token> local_118;
  _Rb_tree_node_base local_f0;
  size_t local_d0;
  pointer pSStack_c8;
  pointer local_c0;
  pointer pSStack_b8;
  undefined1 local_b0 [24];
  optional<tinyusdz::Animatable<bool>> aoStack_98 [4];
  undefined4 local_94;
  storage_t<tinyusdz::Animatable<bool>_> local_90;
  bool local_68;
  pointer local_58;
  pointer local_48;
  bool local_38;
  
  local_338 = 0;
  uStack_330 = 0;
  pcStack_320 = ::std::
                _Function_handler<nonstd::expected_lite::expected<tinyusdz::CollectionInstance::ExpansionRule,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:2642:131)>
                ::_M_invoke;
  local_328 = ::std::
              _Function_handler<nonstd::expected_lite::expected<tinyusdz::CollectionInstance::ExpansionRule,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:2642:131)>
              ::_M_manager;
  local_628 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)table;
  if (coll == (Collection *)0x0) {
    bVar29 = false;
  }
  else {
    p_Var12 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var22 = &(properties->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var12 == p_Var22) {
      bVar29 = true;
    }
    else {
      local_5ac = (undefined4)CONCAT71(in_register_00000089,strict_allowedToken_check);
      local_5b8 = (_Base_ptr)&(table->_M_t)._M_impl.super__Rb_tree_header;
      local_5c0 = (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_b0;
      args_1 = (TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *)err;
      local_5d0 = warn;
      local_5c8 = &coll->_instances;
      local_300 = &p_Var22->_M_header;
      do {
        p_Var21 = p_Var12 + 1;
        local_2b8._0_8_ = (long)local_2b8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"collection:","");
        p_Var25 = (_Base_ptr)CONCAT44(local_2b8._12_4_,local_2b8._8_4_);
        if (p_Var12[1]._M_parent < p_Var25) {
          bVar29 = false;
        }
        else if (p_Var25 == (_Base_ptr)0x0) {
          bVar29 = true;
        }
        else {
          iVar8 = bcmp((void *)local_2b8._0_8_,*(void **)p_Var21,(size_t)p_Var25);
          bVar29 = iVar8 == 0;
        }
        if (local_2b8._0_8_ != (long)local_2b8 + 0x10) {
          operator_delete((void *)local_2b8._0_8_,CONCAT62(local_2b8._18_6_,local_2b8._16_2_) + 1);
        }
        cVar27 = '\0';
        if (bVar29) {
          cVar9 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_628,(key_type *)p_Var21);
          cVar27 = '\x03';
          if (cVar9._M_node == local_5b8) {
            local_2b8._0_8_ = (long)local_2b8 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"collection:","");
            p_Var25 = p_Var12[1]._M_parent;
            p_Var3 = (_Base_ptr)CONCAT44(local_2b8._12_4_,local_2b8._8_4_);
            if ((p_Var25 < p_Var3) ||
               ((p_Var3 != (_Base_ptr)0x0 &&
                (iVar8 = bcmp((void *)local_2b8._0_8_,*(void **)p_Var21,(size_t)p_Var3), iVar8 != 0)
                ))) {
              local_2d8[0] = local_2c8;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)local_2d8,*(long *)p_Var21,
                         (long)&p_Var25->_M_color + *(long *)p_Var21);
            }
            else {
              ::std::__cxx11::string::substr((ulong)local_2d8,(ulong)p_Var21);
            }
            local_638 = p_Var21;
            if (local_2b8._0_8_ != (long)local_2b8 + 0x10) {
              operator_delete((void *)local_2b8._0_8_,
                              CONCAT62(local_2b8._18_6_,local_2b8._16_2_) + 1);
            }
            local_548._0_8_ = &aStack_538;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_548,":","");
            local_588.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_588.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_588.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            lVar20 = 0x147ae15;
            uVar10 = 0;
            do {
              uVar10 = ::std::__cxx11::string::find_first_not_of
                                 ((char *)local_2d8,local_548._0_8_,uVar10);
              if (uVar10 == 0xffffffffffffffff) break;
              uVar10 = ::std::__cxx11::string::find((char *)local_2d8,local_548._0_8_,uVar10);
              ::std::__cxx11::string::substr((ulong)local_2b8,(ulong)local_2d8);
              ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_588,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2b8);
              if (local_2b8._0_8_ != (long)local_2b8 + 0x10) {
                operator_delete((void *)local_2b8._0_8_,
                                CONCAT62(local_2b8._18_6_,local_2b8._16_2_) + 1);
              }
              lVar20 = lVar20 + -1;
            } while (lVar20 != 0);
            p_Var21 = local_638;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_548._0_8_ != &aStack_538) {
              operator_delete((void *)local_548._0_8_,
                              CONCAT44(aStack_538._M_allocated_capacity._4_4_,
                                       aStack_538._M_allocated_capacity._0_4_) + 1);
            }
            pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)local_588.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_588.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
            if (pbVar18 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000040)
            {
              if ((local_588.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_string_length == 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2b8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2b8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2b8,"ReconstructCollectionProperties",0x1f);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,"():",3);
                poVar14 = (ostream *)
                          ::std::ostream::operator<<
                                    ((TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *)
                                     local_2b8,0xa6d);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                lVar20 = 0x33;
                pcVar23 = "INSTANCE_NAME is empty for collection property name";
LAB_0022d87c:
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2b8,pcVar23,lVar20);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,"\n",1);
                goto LAB_0022d895;
              }
              if (local_588.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length == 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2b8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2b8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2b8,"ReconstructCollectionProperties",0x1f);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,"():",3);
                poVar14 = (ostream *)
                          ::std::ostream::operator<<
                                    ((TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *)
                                     local_2b8,0xa70);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                lVar20 = 0x21;
                pcVar23 = "Collection property name is empty";
                goto LAB_0022d87c;
              }
              pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_378 + 0x10);
              pcVar2 = ((local_588.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
              local_378._0_8_ = pbVar18;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)local_378,pcVar2,
                         pcVar2 + (local_588.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
              iVar8 = ::std::__cxx11::string::compare
                                ((char *)(local_588.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 1));
              if (iVar8 == 0) {
                if (((ulong)p_Var12[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
                  pCVar11 = ordered_dict<tinyusdz::CollectionInstance>::get_or_add
                                      (local_5c8,(string *)local_378);
                  nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                            (&pCVar11->includes,(Relationship *)&p_Var12[0x17]._M_left);
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            (local_628,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             p_Var21);
                  cVar27 = '\0';
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2b8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2b8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2b8,"ReconstructCollectionProperties",0x1f);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,"():",3)
                  ;
                  poVar14 = (ostream *)
                            ::std::ostream::operator<<
                                      ((TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *)
                                       local_2b8,0xa78);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                  local_670._0_8_ = &local_660;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_670,"`{}` must be a Relationship","");
                  fmt::format<std::__cxx11::string>
                            ((string *)local_548,(fmt *)local_670,(string *)p_Var21,pbVar18);
                  poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2b8,(char *)local_548._0_8_,
                                       stack0xfffffffffffffac0);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_548._0_8_ != &aStack_538) {
                    operator_delete((void *)local_548._0_8_,
                                    CONCAT44(aStack_538._M_allocated_capacity._4_4_,
                                             aStack_538._M_allocated_capacity._0_4_) + 1);
                  }
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_670._0_8_ != &local_660) {
                    operator_delete((void *)local_670._0_8_,(ulong)(local_660._M_dataplus._M_p + 1))
                    ;
                  }
                  if (err != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar13 = (long *)::std::__cxx11::string::_M_append
                                                (local_670,(ulong)(err->_M_dataplus)._M_p);
                    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)(plVar13 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar13 == paVar1) {
                      aStack_538._M_allocated_capacity._0_4_ =
                           (undefined4)paVar1->_M_allocated_capacity;
                      aStack_538._M_allocated_capacity._4_4_ =
                           (undefined4)(paVar1->_M_allocated_capacity >> 0x20);
                      aStack_538._M_local_buf[8] = (char)plVar13[3];
                      aStack_538._9_7_ = (undefined7)((ulong)plVar13[3] >> 8);
                      local_548._0_8_ = &aStack_538;
                    }
                    else {
                      aStack_538._M_allocated_capacity._0_4_ =
                           (undefined4)paVar1->_M_allocated_capacity;
                      aStack_538._M_allocated_capacity._4_4_ =
                           (undefined4)(paVar1->_M_allocated_capacity >> 0x20);
                      local_548._0_8_ =
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)*plVar13;
                    }
                    unique0x00012000 = plVar13[1];
                    *plVar13 = (long)paVar1;
                    plVar13[1] = 0;
                    *(undefined1 *)(plVar13 + 2) = 0;
                    ::std::__cxx11::string::operator=((string *)err,(string *)local_548);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_548._0_8_ != &aStack_538) {
LAB_0022e49c:
                      operator_delete((void *)local_548._0_8_,
                                      CONCAT44(aStack_538._M_allocated_capacity._4_4_,
                                               aStack_538._M_allocated_capacity._0_4_) + 1);
                    }
LAB_0022e4ac:
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_670._0_8_ != &local_660) {
                      operator_delete((void *)local_670._0_8_,
                                      (ulong)(local_660._M_dataplus._M_p + 1));
                    }
                  }
LAB_0022e4c8:
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b8);
                  ::std::ios_base::~ios_base((ios_base *)(local_2b8 + 0x70));
                  cVar27 = '\x01';
                }
              }
              else {
                iVar8 = ::std::__cxx11::string::compare
                                  ((char *)(local_588.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 1));
                if (iVar8 == 0) {
                  local_2b8._0_8_ = ((ulong)local_2b8._0_8_ >> 8 & 0xffffff) << 8;
                  local_2b8._8_4_ = local_2b8._8_4_ & 0xffffff00;
                  local_2b8._12_4_ = (storage_t<unsigned_int>)0x0;
                  local_2b8[0x10] = false;
                  local_2b8[0x11] = (storage_t<bool>)0x0;
                  local_2b8[0x18] = false;
                  local_228 = (storage_t<double>)0x0;
                  local_220 = false;
                  local_118._16_8_ = 0;
                  local_118._24_8_ = 0;
                  local_118.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                  local_118._8_8_ = 0;
                  local_f0._M_color = _S_red;
                  local_f0._M_parent = (_Base_ptr)0x0;
                  local_2b8[0x50] = false;
                  local_2b8._64_8_ = 0;
                  local_2b8._72_8_ = 0;
                  local_2b8._48_8_ = 0;
                  local_2b8._56_8_ = 0;
                  local_2b8._32_8_ = (anon_struct_8_0_00000001_for___align)0x0;
                  local_2b8._40_8_ = 0;
                  local_230 = false;
                  local_2b8._120_8_ = 0;
                  local_2b8._128_8_ = 0;
                  local_2b8._104_8_ = 0;
                  local_2b8._112_8_ = 0;
                  local_2b8._88_8_ = (anon_struct_8_0_00000001_for___align)0x0;
                  local_2b8._96_8_ = 0;
                  local_1f8 = false;
                  local_218._16_8_ = 0;
                  local_218._24_8_ = 0;
                  local_218.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                  local_218._8_8_ = 0;
                  local_1d0 = false;
                  local_1f0._16_8_ = 0;
                  local_1f0._24_8_ = 0;
                  local_1f0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                  local_1f0._8_8_ = 0;
                  local_1a8 = false;
                  local_1c8._16_8_ = 0;
                  local_1c8._24_8_ = 0;
                  local_1c8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                  local_1c8._8_8_ = 0;
                  local_170 = false;
                  local_1a0._32_8_ = 0;
                  local_1a0._40_8_ = 0;
                  local_1a0._16_8_ = 0;
                  local_1a0._24_8_ = 0;
                  local_1a0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                  local_1a0._8_8_ = 0;
                  local_148 = false;
                  local_168._16_8_ = 0;
                  local_168._24_8_ = 0;
                  local_168.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                  local_168._8_8_ = 0;
                  local_120 = false;
                  local_140._16_8_ = 0;
                  local_140._24_8_ = 0;
                  local_140.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                  local_140._8_8_ = 0;
                  local_f0._M_left = &local_f0;
                  local_94 = 0;
                  local_90._0_1_ = 0;
                  local_b0[0x10] = 0;
                  stack0xffffffffffffff61 = 0;
                  local_b0._0_8_ = (pointer)0x0;
                  local_b0[8] = 0;
                  local_b0._9_7_ = 0;
                  local_c0 = (pointer)0x0;
                  pSStack_b8 = (pointer)0x0;
                  local_d0 = 0;
                  pSStack_c8 = (pointer)0x0;
                  local_90._4_4_ = 0;
                  local_90._8_1_ = 0;
                  local_f0._M_right = local_f0._M_left;
                  cVar9 = ::std::
                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_628,(key_type *)p_Var21);
                  cVar27 = '\x03';
                  if (cVar9._M_node == local_5b8) {
                    if (((ulong)p_Var12[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
                      local_548._0_8_ = &aStack_538;
                      stack0xfffffffffffffac0 = (pointer)0x0;
                      aStack_538._M_allocated_capacity._0_4_ =
                           aStack_538._M_allocated_capacity._0_4_ & 0xffffff00;
                    }
                    else {
                      Attribute::type_name_abi_cxx11_
                                ((string *)local_548,(Attribute *)(p_Var12 + 2));
                    }
                    local_670._0_8_ = &local_660;
                    local_670._8_8_ = (anon_struct_8_0_00000001_for___align)0x5;
                    local_660._M_dataplus._M_p._0_6_ = 0x6e656b6f74;
                    if ((((pointer)stack0xfffffffffffffac0 == (pointer)0x5) &&
                        (iVar8 = bcmp((void *)local_548._0_8_,&local_660,5), iVar8 == 0)) &&
                       (uVar26 = *(uint *)((long)&p_Var12[0x17]._M_parent + 4), uVar26 < 2)) {
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_548._0_8_ != &aStack_538) {
                        operator_delete((void *)local_548._0_8_,
                                        CONCAT44(aStack_538._M_allocated_capacity._4_4_,
                                                 aStack_538._M_allocated_capacity._0_4_) + 1);
                      }
                      p_Var21 = local_638;
                      if (uVar26 == 0) {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_548);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_548,"[warn]",6);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_548,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                   ,0x5a);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_548,":",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_548,"ReconstructCollectionProperties",0x1f);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_548,"():",3);
                        poVar14 = (ostream *)
                                  ::std::ostream::operator<<((ostringstream *)local_548,0xa84);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_548,"No value assigned to `",0x16);
                        poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_548,*(char **)(p_Var12 + 1),
                                             (long)p_Var12[1]._M_parent);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar14,"` token attribute. Set default token value.",0x2b);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
                        if (local_5d0 != (string *)0x0) {
                          ::std::__cxx11::stringbuf::str();
                          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_670,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_620,err);
                          ::std::__cxx11::string::operator=((string *)local_5d0,(string *)local_670)
                          ;
                          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_670._0_8_ != &local_660) {
                            operator_delete((void *)local_670._0_8_,
                                            (ulong)(local_660._M_dataplus._M_p + 1));
                          }
                          p_Var21 = local_638;
                          if ((undefined1 *)local_620._0_8_ != local_620 + 0x10) {
                            operator_delete((void *)local_620._0_8_,
                                            CONCAT44(local_620._20_4_,local_620._16_4_) + 1);
                            p_Var21 = local_638;
                          }
                        }
                        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_548);
                        ::std::ios_base::~ios_base(local_4d8);
                        AttrMetas::operator=((AttrMetas *)local_2b8,(AttrMetas *)(p_Var12 + 7));
                        ::std::
                        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        ::_M_insert_unique<std::__cxx11::string_const&>
                                  (local_628,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)p_Var21);
                        goto LAB_0022f0f7;
                      }
                    }
                    else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)local_548._0_8_ != &aStack_538) {
                      operator_delete((void *)local_548._0_8_,
                                      CONCAT44(aStack_538._M_allocated_capacity._4_4_,
                                               aStack_538._M_allocated_capacity._0_4_) + 1);
                    }
                    p_Var21 = local_638;
                    aStack_538._M_allocated_capacity._0_4_ = 0;
                    aStack_538._M_allocated_capacity._4_4_ = 0;
                    aStack_538._M_local_buf[8] = '\0';
                    aStack_538._9_7_ = 0;
                    local_548._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
                    stack0xfffffffffffffac0 = (pointer)0x0;
                    if (local_328 != (code *)0x0) {
                      (*local_328)(local_548,&local_338,2);
                      aStack_538._M_allocated_capacity._0_4_ = SUB84(local_328,0);
                      aStack_538._M_allocated_capacity._4_4_ =
                           (undefined4)((ulong)local_328 >> 0x20);
                      aStack_538._M_local_buf[8] = (char)pcStack_320;
                      aStack_538._9_7_ = (undefined7)((ulong)pcStack_320 >> 8);
                    }
                    local_388 = (code *)0x0;
                    uStack_380 = 0;
                    local_398._M_allocated_capacity = 0;
                    local_398._8_8_ = 0;
                    if ((code *)CONCAT44(aStack_538._M_allocated_capacity._4_4_,
                                         aStack_538._M_allocated_capacity._0_4_) != (code *)0x0) {
                      (*(code *)CONCAT44(aStack_538._M_allocated_capacity._4_4_,
                                         aStack_538._M_allocated_capacity._0_4_))
                                (&local_398,local_548,2);
                      local_388 = (code *)CONCAT44(aStack_538._M_allocated_capacity._4_4_,
                                                   aStack_538._M_allocated_capacity._0_4_);
                      uStack_380 = CONCAT71(aStack_538._9_7_,aStack_538._M_local_buf[8]);
                    }
                    args_1 = (TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *)local_2b8;
                    bVar29 = ParseUniformEnumProperty<tinyusdz::CollectionInstance::ExpansionRule,tinyusdz::CollectionInstance::ExpansionRule>
                                       ((string *)p_Var21,local_5ac._0_1_,
                                        (EnumHandlerFun<tinyusdz::CollectionInstance::ExpansionRule>
                                         *)&local_398,(Attribute *)(p_Var12 + 2),
                                        (TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>
                                         *)local_2b8,local_5d0,err);
                    if (local_388 != (code *)0x0) {
                      (*local_388)((_Any_data *)&local_398,(_Any_data *)&local_398,__destroy_functor
                                  );
                    }
                    cVar27 = '\x01';
                    if (bVar29) {
                      AttrMetas::operator=((AttrMetas *)local_2b8,(AttrMetas *)(p_Var12 + 7));
                      ::std::
                      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      ::_M_insert_unique<std::__cxx11::string_const&>
                                (local_628,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)p_Var21);
                      cVar27 = '\x03';
                    }
                    if ((code *)CONCAT44(aStack_538._M_allocated_capacity._4_4_,
                                         aStack_538._M_allocated_capacity._0_4_) != (code *)0x0) {
                      (*(code *)CONCAT44(aStack_538._M_allocated_capacity._4_4_,
                                         aStack_538._M_allocated_capacity._0_4_))
                                (local_548,local_548,3);
                    }
                  }
                }
                else {
                  iVar8 = ::std::__cxx11::string::compare
                                    ((char *)(local_588.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start + 1));
                  if (iVar8 != 0) {
                    iVar8 = ::std::__cxx11::string::compare
                                      ((char *)(local_588.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start + 1));
                    cVar27 = '\0';
                    if (iVar8 == 0) {
                      if (((ulong)p_Var12[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b8);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2b8,"[error]",7);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2b8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                   ,0x5a);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2b8,":",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2b8,"ReconstructCollectionProperties",0x1f);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2b8,"():",3);
                        poVar14 = (ostream *)
                                  ::std::ostream::operator<<
                                            ((TypedAttributeWithFallback<tinyusdz::Animatable<bool>_>
                                              *)local_2b8,0xa96);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                        local_670._0_8_ = &local_660;
                        ::std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_670,"`{}` must be a Relationship","");
                        fmt::format<std::__cxx11::string>
                                  ((string *)local_548,(fmt *)local_670,(string *)p_Var21,pbVar18);
                        poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_2b8,(char *)local_548._0_8_,
                                             stack0xfffffffffffffac0);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_548._0_8_ != &aStack_538) {
                          operator_delete((void *)local_548._0_8_,
                                          CONCAT44(aStack_538._M_allocated_capacity._4_4_,
                                                   aStack_538._M_allocated_capacity._0_4_) + 1);
                        }
                        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_670._0_8_ != &local_660) {
                          operator_delete((void *)local_670._0_8_,
                                          (ulong)(local_660._M_dataplus._M_p + 1));
                        }
                        if (err != (string *)0x0) {
                          ::std::__cxx11::stringbuf::str();
                          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_548,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_670,err);
                          ::std::__cxx11::string::operator=((string *)err,(string *)local_548);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_548._0_8_ != &aStack_538) goto LAB_0022e49c;
                          goto LAB_0022e4ac;
                        }
                        goto LAB_0022e4c8;
                      }
                      pCVar11 = ordered_dict<tinyusdz::CollectionInstance>::get_or_add
                                          (local_5c8,(string *)local_378);
                      nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                                (&pCVar11->excludes,(Relationship *)&p_Var12[0x17]._M_left);
                      ::std::
                      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      ::_M_insert_unique<std::__cxx11::string_const&>
                                (local_628,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)p_Var21);
                    }
                    goto LAB_0022f10c;
                  }
                  aStack_538._M_local_buf[8] = '\0';
                  aStack_538._9_7_ = 0;
                  bStack_528 = false;
                  stack0xfffffffffffffac0 = (pointer)0x0;
                  aStack_538._M_allocated_capacity._0_4_ = 0;
                  aStack_538._M_allocated_capacity._4_4_ = 0;
                  local_548._2_6_ = SUB86(local_548._0_8_,2) & 0xffffffffff00;
                  local_548._0_2_ = 0x100;
                  TypedAttributeWithFallback<tinyusdz::Animatable<bool>_>::
                  TypedAttributeWithFallback
                            ((TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *)local_2b8,
                             (Animatable<bool> *)local_548);
                  if ((pointer)stack0xfffffffffffffac0 != (pointer)0x0) {
                    operator_delete((void *)stack0xfffffffffffffac0,
                                    CONCAT71(aStack_538._9_7_,aStack_538._M_local_buf[8]) -
                                    stack0xfffffffffffffac0);
                  }
                  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_2f8,*(long *)(p_Var12 + 1),
                             (long)&(p_Var12[1]._M_parent)->_M_color + *(long *)(p_Var12 + 1));
                  local_5f0._0_8_ = local_5f0 + 0x10;
                  local_5f0._8_8_ = 0;
                  local_5f0[0x10] = '\0';
                  iVar8 = ::std::__cxx11::string::compare((string *)&local_2f8);
                  if (iVar8 == 0) {
                    if (((ulong)p_Var12[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
                      local_5f8 = 7;
                      local_670._0_8_ = &local_660;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_670,
                                 "Property {} must be Attribute, but declared as Relationhip.","");
                      fmt::format<std::__cxx11::string>
                                ((string *)local_548,(fmt *)local_670,(string *)p_Var21,pbVar18);
                      ::std::__cxx11::string::operator=((string *)local_5f0,(string *)local_548);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_548._0_8_ != &aStack_538) {
                        operator_delete((void *)local_548._0_8_,
                                        CONCAT44(aStack_538._M_allocated_capacity._4_4_,
                                                 aStack_538._M_allocated_capacity._0_4_) + 1);
                      }
                      _Var24._M_p = local_660._M_dataplus._M_p;
                      pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_670._0_8_;
                      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_670._0_8_ == &local_660) goto LAB_0022ee38;
                    }
                    else {
                      Attribute::type_name_abi_cxx11_
                                ((string *)local_3b8,(Attribute *)(p_Var12 + 2));
                      local_548._0_8_ = &aStack_538;
                      aStack_538._M_allocated_capacity._0_4_ = 0x6c6f6f62;
                      stack0xfffffffffffffac0 = (pointer)0x4;
                      aStack_538._M_allocated_capacity._4_4_ =
                           aStack_538._M_allocated_capacity._4_4_ & 0xffffff00;
                      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_3b8._8_8_ ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4)
                      {
                        bVar29 = *(int *)local_3b8._0_8_ == 0x6c6f6f62;
                      }
                      else {
                        bVar29 = false;
                      }
                      bVar28 = true;
                      pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_3b8._8_8_;
                      if (!bVar29) {
                        local_358 = &local_348;
                        local_348 = 0x6c6f6f62;
                        local_350 = 4;
                        uStack_344 = uStack_344 & 0xffffff00;
                        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_3b8._8_8_ ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4
                           ) {
                          bVar28 = *(int *)local_3b8._0_8_ == 0x6c6f6f62;
                          pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_3b8._0_8_;
                        }
                        else {
                          bVar28 = false;
                        }
                      }
                      if ((!bVar29) && (local_358 != &local_348)) {
                        operator_delete(local_358,CONCAT44(uStack_344,local_348) + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_548._0_8_ != &aStack_538) {
                        operator_delete((void *)local_548._0_8_,
                                        CONCAT44(aStack_538._M_allocated_capacity._4_4_,
                                                 aStack_538._M_allocated_capacity._0_4_) + 1);
                      }
                      p_Var21 = local_638;
                      if (bVar28) {
                        p_Var25 = p_Var12[6]._M_parent;
                        p_Var3 = p_Var12[6]._M_left;
                        if (p_Var3 != p_Var25) {
                          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                                    (local_5c0,
                                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                                     &p_Var12[6]._M_parent);
                        }
                        iVar8 = *(int *)((long)&p_Var12[0x17]._M_parent + 4);
                        if (iVar8 == 1) {
                          local_3c0 = p_Var3;
                          if (p_Var12[5]._M_left == p_Var12[5]._M_parent) {
                            if (p_Var12[4]._M_right == (_Base_ptr)0x0) {
                              bVar29 = false;
                            }
                            else {
                              iVar8 = (**(code **)p_Var12[4]._M_right)();
                              bVar29 = iVar8 == 4;
                            }
                            if ((!bVar29) && ((p_Var12[5]._M_color & _S_black) == _S_red))
                            goto LAB_0022e804;
                            local_38 = true;
LAB_0022e966:
                            local_63c = 0;
LAB_0022e96e:
                            local_620._0_8_ = local_620._0_8_ & 0xffffffffff000000;
                            local_620[0x18] = '\0';
                            local_620._25_7_ = 0;
                            bStack_600 = false;
                            local_620._8_8_ = (pointer)0x0;
                            local_620._16_4_ = 0;
                            local_620._20_4_ = 0;
                            local_310 = (PrimVar *)&p_Var12[4]._M_parent;
                            local_308 = p_Var25;
                            if (p_Var12[5]._M_left == p_Var12[5]._M_parent) {
                              local_62c = 0;
LAB_0022ebae:
                              this = local_310;
                              if (((char)p_Var12[5]._M_color == _S_red) &&
                                 (((p_Var12[4]._M_right != (_Base_ptr)0x0 &&
                                   (iVar8 = (**(code **)p_Var12[4]._M_right)(), iVar8 == 0)) ||
                                  ((p_Var12[4]._M_right != (_Base_ptr)0x0 &&
                                   (iVar8 = (**(code **)p_Var12[4]._M_right)(), iVar8 == 1)))))) {
                                bVar29 = false;
                                uVar19 = local_62c;
                              }
                              else {
                                primvar::PrimVar::get_value<bool>((PrimVar *)local_548);
                                uVar7 = local_548[0];
                                if ((string)local_548[0] == (string)0x1) {
                                  local_620._1_2_ = 1;
                                  local_620[0] = local_548[1];
                                  uVar19 = local_62c;
                                }
                                else {
                                  local_5f8 = 8;
                                  local_670._0_8_ = &local_660;
                                  ::std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)local_670,
                                             "Internal error. Invalid attribute value? get_value<{}> failed. Attribute has type {}"
                                             ,"");
                                  local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
                                  local_5a8.field_2._M_allocated_capacity._0_4_ = 0x6c6f6f62;
                                  local_5a8._M_string_length = 4;
                                  local_5a8.field_2._M_allocated_capacity._4_4_ =
                                       local_5a8.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
                                  primvar::PrimVar::type_name_abi_cxx11_(&local_568,this);
                                  fmt::format<std::__cxx11::string,std::__cxx11::string>
                                            ((string *)local_548,(fmt *)local_670,&local_5a8,
                                             &local_568,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)args_1);
                                  ::std::__cxx11::string::operator=
                                            ((string *)local_5f0,(string *)local_548);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_548._0_8_ != &aStack_538) {
                                    operator_delete((void *)local_548._0_8_,
                                                    CONCAT44(aStack_538._M_allocated_capacity._4_4_,
                                                             aStack_538._M_allocated_capacity._0_4_)
                                                    + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_568._M_dataplus._M_p != &local_568.field_2) {
                                    operator_delete(local_568._M_dataplus._M_p,
                                                    CONCAT44(local_568.field_2._M_allocated_capacity
                                                             ._4_4_,local_568.field_2.
                                                                    _M_allocated_capacity._0_4_) + 1
                                                   );
                                  }
                                  uVar19 = local_62c;
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
                                    operator_delete(local_5a8._M_dataplus._M_p,
                                                    CONCAT44(local_5a8.field_2._M_allocated_capacity
                                                             ._4_4_,local_5a8.field_2.
                                                                    _M_allocated_capacity._0_4_) + 1
                                                   );
                                  }
                                  pbVar18 = &local_660;
                                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_670._0_8_ != pbVar18) {
                                    operator_delete((void *)local_670._0_8_,
                                                    (ulong)(local_660._M_dataplus._M_p + 1));
                                    pbVar18 = extraout_RAX_01;
                                  }
                                  local_63c = (uint)CONCAT71((int7)((ulong)pbVar18 >> 8),1);
                                }
                                cVar27 = (char)uVar19;
                                bVar29 = true;
                                bVar28 = false;
                                if ((string)uVar7 == (string)0x0) {
                                  bVar29 = false;
                                  goto LAB_0022ed90;
                                }
                              }
                              cVar27 = (char)uVar19;
                              if ((cVar27 != '\0') || (bVar28 = true, bVar29)) {
                                nonstd::optional_lite::optional<tinyusdz::Animatable<bool>>::
                                operator=(aoStack_98,(Animatable<bool> *)local_620);
                                bVar28 = true;
                              }
                            }
                            else {
                              ConvertToAnimatable<bool>
                                        ((optional<tinyusdz::Animatable<bool>_> *)local_670,
                                         local_310);
                              fVar6 = local_670[0];
                              local_548[0] = local_670[0];
                              if (local_670[0] == (fmt)0x1) {
                                uStack_53e._0_1_ = local_670[10];
                                local_548._8_2_ = local_670._8_2_;
                                aStack_538._M_allocated_capacity._0_4_ =
                                     SUB84(local_660._M_dataplus._M_p,0);
                                aStack_538._M_allocated_capacity._4_4_ =
                                     (undefined4)((ulong)local_660._M_dataplus._M_p >> 0x20);
                                aStack_538._M_local_buf[8] = (char)local_660._M_string_length;
                                aStack_538._9_7_ = (undefined7)(local_660._M_string_length >> 8);
                                bStack_528 = SUB81(local_660.field_2._M_allocated_capacity,0);
                                uStack_527 = (undefined7)((ulong)local_660.field_2._0_8_ >> 8);
                                local_660._M_dataplus._M_p = (pointer)0x0;
                                local_660._M_string_length = 0;
                                local_660.field_2._M_allocated_capacity = 0;
                                local_520 = local_660.field_2._M_local_buf[8];
                                local_620._0_3_ = (undefined3)local_670._8_8_;
                                pvVar15 = ::std::
                                          vector<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                                          ::operator=((
                                                  vector<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                                                  *)(local_620 + 8),
                                                  (
                                                  vector<tinyusdz::TypedTimeSamples<bool>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>_>
                                                  *)&aStack_538);
                                uVar16 = CONCAT71((int7)((ulong)pvVar15 >> 8),local_520);
                                bStack_600 = (bool)local_520;
                              }
                              else {
                                local_5f8 = 8;
                                local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
                                ::std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_5a8,
                                           "Converting timeSamples Attribute data failed for `{}`. Guess TimeSamples have values with different type(expected is `{}`)?"
                                           ,"");
                                local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
                                local_568.field_2._M_allocated_capacity._0_4_ = 0x6c6f6f62;
                                local_568._M_string_length = 4;
                                local_568.field_2._M_allocated_capacity._4_4_ =
                                     local_568.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
                                fmt::format<std::__cxx11::string,std::__cxx11::string>
                                          ((string *)local_670,(fmt *)&local_5a8,&local_2f8,
                                           &local_568,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)args_1);
                                ::std::__cxx11::string::operator=
                                          ((string *)local_5f0,(string *)local_670);
                                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_670._0_8_ != &local_660) {
                                  operator_delete((void *)local_670._0_8_,
                                                  (ulong)(local_660._M_dataplus._M_p + 1));
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_568._M_dataplus._M_p != &local_568.field_2) {
                                  operator_delete(local_568._M_dataplus._M_p,
                                                  CONCAT44(local_568.field_2._M_allocated_capacity.
                                                           _4_4_,local_568.field_2.
                                                                 _M_allocated_capacity._0_4_) + 1);
                                }
                                paVar17 = &local_5a8.field_2;
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_5a8._M_dataplus._M_p != paVar17) {
                                  operator_delete(local_5a8._M_dataplus._M_p,
                                                  CONCAT44(local_5a8.field_2._M_allocated_capacity.
                                                           _4_4_,local_5a8.field_2.
                                                                 _M_allocated_capacity._0_4_) + 1);
                                  paVar17 = extraout_RAX;
                                }
                                uVar16 = CONCAT71((int7)((ulong)paVar17 >> 8),1);
                                local_63c = (uint)uVar16;
                              }
                              if (((string)local_548[0] == (string)0x1) &&
                                 (pvVar4 = (void *)CONCAT44(aStack_538._M_allocated_capacity._4_4_,
                                                            aStack_538._M_allocated_capacity._0_4_),
                                 pvVar4 != (void *)0x0)) {
                                operator_delete(pvVar4,CONCAT71(uStack_527,bStack_528) -
                                                       (long)pvVar4);
                                uVar16 = extraout_RAX_00;
                              }
                              local_62c = (undefined4)CONCAT71((int7)((ulong)uVar16 >> 8),1);
                              bVar29 = false;
                              cVar27 = '\0';
                              bVar28 = false;
                              if (fVar6 != (fmt)0x0) goto LAB_0022ebae;
                            }
LAB_0022ed90:
                            if ((pointer)local_620._8_8_ != (pointer)0x0) {
                              operator_delete((void *)local_620._8_8_,
                                              CONCAT71(local_620._25_7_,local_620[0x18]) -
                                              local_620._8_8_);
                            }
                            p_Var25 = local_308;
                            if (bVar28) goto LAB_0022edbb;
                          }
                          else {
LAB_0022e804:
                            if (p_Var12[3]._M_color != _S_black) goto LAB_0022e966;
                            bVar29 = primvar::PrimVar::is_timesamples
                                               ((PrimVar *)&p_Var12[4]._M_parent);
                            if (bVar29) {
                              local_5f8 = 4;
                              local_670._0_8_ = &local_660;
                              ::std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_670,
                                         "TimeSample value is assigned to `uniform` property `{}",""
                                        );
                              fmt::format<std::__cxx11::string>
                                        ((string *)local_548,(fmt *)local_670,(string *)p_Var21,
                                         pbVar18);
                              ::std::__cxx11::string::operator=
                                        ((string *)local_5f0,(string *)local_548);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_548._0_8_ != &aStack_538) {
                                operator_delete((void *)local_548._0_8_,
                                                CONCAT44(aStack_538._M_allocated_capacity._4_4_,
                                                         aStack_538._M_allocated_capacity._0_4_) + 1
                                               );
                              }
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_670._0_8_ != &local_660) {
                                operator_delete((void *)local_670._0_8_,
                                                (ulong)(local_660._M_dataplus._M_p + 1));
                              }
                              goto LAB_0022ee13;
                            }
                            primvar::PrimVar::get_value<bool>((PrimVar *)local_548);
                            uVar26 = (uint)CONCAT71((int7)((ulong)&p_Var12[4]._M_parent >> 8),
                                                    local_548[0]);
                            if ((string)local_548[0] == (string)0x1) {
                              uVar5 = SUB85(local_548._0_8_,3);
                              aStack_538._M_local_buf[8] = '\0';
                              aStack_538._9_7_ = 0;
                              bStack_528 = false;
                              stack0xfffffffffffffac0 = (pointer)0x0;
                              aStack_538._M_allocated_capacity._0_4_ = 0;
                              aStack_538._M_allocated_capacity._4_4_ = 0;
                              local_548._0_3_ = CONCAT21(1,local_548[1]);
                              local_548._0_8_ = CONCAT53(uVar5,local_548._0_3_);
                              nonstd::optional_lite::optional<tinyusdz::Animatable<bool>>::operator=
                                        (aoStack_98,(Animatable<bool> *)local_548);
                              if ((pointer)stack0xfffffffffffffac0 != (pointer)0x0) {
                                operator_delete((void *)stack0xfffffffffffffac0,
                                                CONCAT71(aStack_538._9_7_,aStack_538._M_local_buf[8]
                                                        ) - stack0xfffffffffffffac0);
                              }
                            }
                            else {
                              local_5f8 = 3;
                              local_670._0_8_ = &local_660;
                              local_63c = uVar26;
                              ::std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_670,
                                         "Fallback. Failed to retrieve value with requested type `{}`."
                                         ,"");
                              local_620._0_8_ = local_620 + 0x10;
                              local_620._16_4_ = 0x6c6f6f62;
                              local_620._8_8_ = (pointer)0x4;
                              local_620._20_4_ = local_620._20_4_ & 0xffffff00;
                              fmt::format<std::__cxx11::string>
                                        ((string *)local_548,(fmt *)local_670,(string *)local_620,
                                         pbVar18);
                              ::std::__cxx11::string::operator=
                                        ((string *)local_5f0,(string *)local_548);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_548._0_8_ != &aStack_538) {
                                operator_delete((void *)local_548._0_8_,
                                                CONCAT44(aStack_538._M_allocated_capacity._4_4_,
                                                         aStack_538._M_allocated_capacity._0_4_) + 1
                                               );
                              }
                              if ((undefined1 *)local_620._0_8_ != local_620 + 0x10) {
                                operator_delete((void *)local_620._0_8_,
                                                CONCAT44(local_620._20_4_,local_620._16_4_) + 1);
                              }
                              uVar26 = local_63c;
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_670._0_8_ != &local_660) {
                                operator_delete((void *)local_670._0_8_,
                                                (ulong)(local_660._M_dataplus._M_p + 1));
                              }
                            }
                            local_63c = uVar26 ^ 1;
                            if ((char)uVar26 == '\x01') goto LAB_0022e96e;
                          }
                          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_3b8._0_8_ !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (local_3b8 + 0x10)) {
                            operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
                          }
                          p_Var21 = local_638;
                          if (((char)local_63c != '\0') ||
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_5f0._0_8_ ==
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (local_5f0 + 0x10))) goto LAB_0022ee38;
                          _Var24._M_p = (pointer)CONCAT71(local_5f0._17_7_,local_5f0[0x10]);
                          pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_5f0._0_8_;
                          goto LAB_0022ee30;
                        }
                        if (iVar8 == 0) {
                          local_68 = true;
                          AttrMetas::operator=((AttrMetas *)local_2b8,(AttrMetas *)(p_Var12 + 7));
                        }
                        else {
                          bVar29 = false;
                          cVar27 = '\0';
                          local_3c0 = p_Var3;
LAB_0022edbb:
                          if (local_3c0 == p_Var25) {
                            if ((cVar27 == '\0') && (!bVar29)) {
                              ::std::__cxx11::string::operator=
                                        ((string *)local_5f0,"Invalid Property type(internal error)"
                                        );
                              local_5f8 = 8;
                              p_Var21 = local_638;
                              goto LAB_0022ee13;
                            }
                          }
                          else if ((cVar27 == '\0') && (!bVar29)) {
                            local_68 = true;
                          }
                          AttrMetas::operator=((AttrMetas *)local_2b8,(AttrMetas *)(p_Var12 + 7));
                          p_Var21 = local_638;
                        }
                        ::std::
                        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        ::_M_insert_unique<std::__cxx11::string_const&>
                                  (local_628,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)p_Var21);
                        local_5f8 = 0;
                      }
                      else {
                        local_5f8 = 3;
                        ::std::__cxx11::stringstream::stringstream((stringstream *)local_548);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)aStack_538._M_local_buf,"Property type mismatch. ",
                                   0x18);
                        poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)aStack_538._M_local_buf,
                                             *(char **)(p_Var12 + 1),(long)p_Var12[1]._M_parent);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar14," expects type `",0xf);
                        local_670._8_8_ = (anon_struct_8_0_00000001_for___align)0x4;
                        local_660._M_dataplus._M_p._0_5_ = 0x6c6f6f62;
                        local_670._0_8_ = &local_660;
                        poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar14,(char *)&local_660,4);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar14,"` but defined as type `",0x17);
                        poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar14,(char *)local_3b8._0_8_,local_3b8._8_8_);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar14,"`",1);
                        p_Var21 = local_638;
                        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_670._0_8_ != &local_660) {
                          operator_delete((void *)local_670._0_8_,
                                          (ulong)(local_660._M_dataplus._M_p + 1));
                        }
                        ::std::__cxx11::stringbuf::str();
                        ::std::__cxx11::string::operator=((string *)local_5f0,(string *)local_670);
                        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_670._0_8_ != &local_660) {
                          operator_delete((void *)local_670._0_8_,
                                          (ulong)(local_660._M_dataplus._M_p + 1));
                        }
                        ::std::__cxx11::stringstream::~stringstream((stringstream *)local_548);
                        ::std::ios_base::~ios_base(local_4c8);
                      }
LAB_0022ee13:
                      _Var24._M_p = (pointer)local_3b8._16_8_;
                      pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_3b8._0_8_;
                      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_3b8._0_8_ ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_3b8 + 0x10)) goto LAB_0022ee38;
                    }
LAB_0022ee30:
                    operator_delete(pbVar18,(ulong)(_Var24._M_p + 1));
                  }
                  else {
                    local_5f8 = 1;
                  }
LAB_0022ee38:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
                    operator_delete(local_2f8._M_dataplus._M_p,
                                    local_2f8.field_2._M_allocated_capacity + 1);
                  }
                  uVar26 = local_5f8;
                  if (2 < local_5f8) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_548);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_548,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_548,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_548,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_548,"ReconstructCollectionProperties",0x1f);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_548,"():",3);
                    poVar14 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)local_548,0xa8d);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                    local_620._0_8_ = local_620 + 0x10;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_620,"Parsing attribute `{}` failed. Error: {}","");
                    p_Var21 = local_638;
                    fmt::format<std::__cxx11::string,std::__cxx11::string>
                              ((string *)local_670,(fmt *)local_620,(string *)local_638,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_5f0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               args_1);
                    poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_548,(char *)local_670._0_8_,
                                         local_670._8_8_);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_670._0_8_ != &local_660) {
                      operator_delete((void *)local_670._0_8_,
                                      (ulong)(local_660._M_dataplus._M_p + 1));
                    }
                    if ((undefined1 *)local_620._0_8_ != local_620 + 0x10) {
                      operator_delete((void *)local_620._0_8_,
                                      CONCAT44(local_620._20_4_,local_620._16_4_) + 1);
                    }
                    if (err != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_670,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_620,err);
                      ::std::__cxx11::string::operator=((string *)err,(string *)local_670);
                      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_670._0_8_ != &local_660) {
                        operator_delete((void *)local_670._0_8_,
                                        (ulong)(local_660._M_dataplus._M_p + 1));
                      }
                      p_Var21 = local_638;
                      if ((undefined1 *)local_620._0_8_ != local_620 + 0x10) {
                        operator_delete((void *)local_620._0_8_,
                                        CONCAT44(local_620._20_4_,local_620._16_4_) + 1);
                        p_Var21 = local_638;
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_548);
                    ::std::ios_base::~ios_base(local_4d8);
                  }
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_5f0._0_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_5f0 + 0x10)) {
                    operator_delete((void *)local_5f0._0_8_,
                                    CONCAT71(local_5f0._17_7_,local_5f0[0x10]) + 1);
                  }
                  if ((uVar26 < 3) &&
                     (cVar9 = ::std::
                              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_628,(key_type *)p_Var21), cVar9._M_node != local_5b8))
                  {
                    pCVar11 = ordered_dict<tinyusdz::CollectionInstance>::get_or_add
                                        (local_5c8,(string *)local_378);
                    TypedAttributeWithFallback<tinyusdz::Animatable<bool>_>::operator=
                              (&pCVar11->includeRoot,
                               (TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *)local_2b8)
                    ;
                  }
                  if (local_58 != (pointer)0x0) {
                    operator_delete(local_58,(long)local_48 - (long)local_58);
                  }
                  if ((aoStack_98[0] == (optional<tinyusdz::Animatable<bool>>)0x1) &&
                     (pvVar4 = (void *)CONCAT71(local_90._9_7_,local_90._8_1_),
                     pvVar4 != (void *)0x0)) {
                    operator_delete(pvVar4,local_90._24_8_ - (long)pvVar4);
                  }
                  cVar27 = 2 < uVar26;
                }
LAB_0022f0f7:
                ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                          ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_5c0);
                AttrMetas::~AttrMetas((AttrMetas *)local_2b8);
              }
LAB_0022f10c:
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_378._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_378 + 0x10)) {
                operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
              }
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2b8,"ReconstructCollectionProperties",0x1f);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,"():",3);
              poVar14 = (ostream *)
                        ::std::ostream::operator<<
                                  ((TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *)
                                   local_2b8,0xa6a);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
              local_670._0_8_ = &local_660;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_670,
                         "Invalid collection property name. Must be \'collection:INSTANCE_NAME:<prop_name>\' but got \'{}\'"
                         ,"");
              fmt::format<std::__cxx11::string>
                        ((string *)local_548,(fmt *)local_670,(string *)p_Var21,pbVar18);
              poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2b8,(char *)local_548._0_8_,
                                   stack0xfffffffffffffac0);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_548._0_8_ != &aStack_538) {
                operator_delete((void *)local_548._0_8_,
                                CONCAT44(aStack_538._M_allocated_capacity._4_4_,
                                         aStack_538._M_allocated_capacity._0_4_) + 1);
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_670._0_8_ != &local_660) {
                operator_delete((void *)local_670._0_8_,(ulong)(local_660._M_dataplus._M_p + 1));
              }
LAB_0022d895:
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar13 = (long *)::std::__cxx11::string::_M_append
                                            (local_670,(ulong)(err->_M_dataplus)._M_p);
                paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(plVar13 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar13 == paVar1) {
                  aStack_538._M_allocated_capacity._0_4_ = (undefined4)paVar1->_M_allocated_capacity
                  ;
                  aStack_538._M_allocated_capacity._4_4_ =
                       (undefined4)(paVar1->_M_allocated_capacity >> 0x20);
                  aStack_538._M_local_buf[8] = (char)plVar13[3];
                  aStack_538._9_7_ = (undefined7)((ulong)plVar13[3] >> 8);
                  local_548._0_8_ = &aStack_538;
                }
                else {
                  aStack_538._M_allocated_capacity._0_4_ = (undefined4)paVar1->_M_allocated_capacity
                  ;
                  aStack_538._M_allocated_capacity._4_4_ =
                       (undefined4)(paVar1->_M_allocated_capacity >> 0x20);
                  local_548._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*plVar13;
                }
                unique0x00012000 = plVar13[1];
                *plVar13 = (long)paVar1;
                plVar13[1] = 0;
                *(undefined1 *)(plVar13 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)err,(string *)local_548);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_548._0_8_ != &aStack_538) {
                  operator_delete((void *)local_548._0_8_,
                                  CONCAT44(aStack_538._M_allocated_capacity._4_4_,
                                           aStack_538._M_allocated_capacity._0_4_) + 1);
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_670._0_8_ != &local_660) {
                  operator_delete((void *)local_670._0_8_,(ulong)(local_660._M_dataplus._M_p + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b8);
              ::std::ios_base::~ios_base((ios_base *)(local_2b8 + 0x70));
              cVar27 = '\x01';
            }
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_588);
            if (local_2d8[0] != local_2c8) {
              operator_delete(local_2d8[0],local_2c8[0] + 1);
            }
          }
        }
        if ((cVar27 != '\x03') && (cVar27 != '\0')) goto LAB_0022f2b1;
        p_Var12 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var12);
      } while (p_Var12 != local_300);
      cVar27 = '\x02';
LAB_0022f2b1:
      bVar29 = cVar27 == '\x02';
    }
  }
  if (local_328 != (code *)0x0) {
    (*local_328)(&local_338,&local_338,3);
  }
  return bVar29;
}

Assistant:

bool ReconstructCollectionProperties(
  std::set<std::string> &table, /* inout */
  const std::map<std::string, Property> &properties,
  Collection *coll, /* inout */
  std::string *warn,
  std::string *err,
  bool strict_allowedToken_check)
{
  constexpr auto kCollectionPrefix = "collection:";

  std::function<nonstd::expected<CollectionInstance::ExpansionRule, std::string>(const std::string &)> ExpansionRuleEnumHandler = [](const std::string &tok) {
  //auto ExpansionRuleEnumHandler = [](const std::string &tok) {
    using EnumTy = std::pair<CollectionInstance::ExpansionRule, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(CollectionInstance::ExpansionRule::ExplicitOnly, kExplicitOnly),
        std::make_pair(CollectionInstance::ExpansionRule::ExpandPrims, kExpandPrims),
        std::make_pair(CollectionInstance::ExpansionRule::ExpandPrimsAndProperties, kExpandPrimsAndProperties),
    };
    return EnumHandler<CollectionInstance::ExpansionRule>("expansionRule", tok, enums);
  };

  if (!coll) {
    return false;
  }

  for (const auto &prop : properties) {
    if (startsWith(prop.first, kCollectionPrefix)) {
      if (table.count(prop.first)) {
         continue;
      }

      std::string suffix = removePrefix(prop.first, kCollectionPrefix);
      std::vector<std::string> names = split(suffix, ":");
      if (names.size() != 2) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid collection property name. Must be 'collection:INSTANCE_NAME:<prop_name>' but got '{}'",  prop.first));
      }
      if (names[0].empty()) {
        PUSH_ERROR_AND_RETURN("INSTANCE_NAME is empty for collection property name");
      }
      if (names[1].empty()) {
        PUSH_ERROR_AND_RETURN("Collection property name is empty");
      }

      std::string instance_name = names[0];

      if (names[1] == "includes") {

        if (!prop.second.is_relationship()) {
          PUSH_ERROR_AND_RETURN(fmt::format("`{}` must be a Relationship", prop.first));
        }

        CollectionInstance &coll_instance = coll->get_or_add_instance(instance_name);
        coll_instance.includes = prop.second.get_relationship();
        table.insert(prop.first);

      } else if (names[1] == "expansionRule") {

        TypedAttributeWithFallback<CollectionInstance::ExpansionRule> r{CollectionInstance::ExpansionRule::ExpandPrims};

        PARSE_UNIFORM_ENUM_PROPERTY(table, prop, prop.first, CollectionInstance::ExpansionRule, ExpansionRuleEnumHandler, CollectionInstance,
                       r, strict_allowedToken_check)

        if (table.count(prop.first)) {
          CollectionInstance &coll_instance = coll->get_or_add_instance(instance_name);
          coll_instance.expansionRule = r.get_value();
        }
      } else if (names[1] == "includeRoot") {

        TypedAttributeWithFallback<Animatable<bool>> includeRoot{false};
        PARSE_TYPED_ATTRIBUTE_NOCONTINUE(table, prop, prop.first, CollectionInstance, includeRoot)

        if (table.count(prop.first)) {
          CollectionInstance &coll_instance = coll->get_or_add_instance(instance_name);
          coll_instance.includeRoot = includeRoot;
        }
      } else if (names[1] == "excludes") {

        if (!prop.second.is_relationship()) {
          PUSH_ERROR_AND_RETURN(fmt::format("`{}` must be a Relationship", prop.first));
        }

        CollectionInstance &coll_instance = coll->get_or_add_instance(instance_name);
        coll_instance.excludes = prop.second.get_relationship();
        table.insert(prop.first);

      }
    }
  }

  return true;
}